

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_ArriveAndDrop_Test::TestBody(BarrierTest_ArriveAndDrop_Test *this)

{
  bool bVar1;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  barrier<yamc::detail::default_barrier_completion> barrier;
  
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&barrier,1);
  local_c0 = &local_b0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_b8 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_drop(&barrier);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::condition_variable::~condition_variable(&barrier.cv_);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndDrop)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.arrive_and_drop());
}